

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution_x86.cpp
# Opt level: O1

int __thiscall ncnn::Convolution_x86::create_pipeline(Convolution_x86 *this,Option *opt)

{
  _func_int *p_Var1;
  _func_int **pp_Var2;
  int *piVar3;
  Allocator *pAVar4;
  void *pvVar5;
  ulong uVar6;
  undefined3 uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  uint uVar10;
  Layer *pLVar11;
  int iVar12;
  long lVar13;
  bool bVar14;
  int inch;
  byte bVar15;
  uint kernel_w;
  int iVar16;
  uint uVar17;
  Option *opt_00;
  uint kernel_h;
  int kernel_h_00;
  char cVar18;
  char cVar19;
  undefined8 uStackY_118;
  undefined8 uStackY_10c;
  undefined8 uStackY_100;
  undefined8 uStack_f0;
  undefined1 auStack_ec [4];
  ParamDict pd_5;
  ParamDict pd;
  undefined4 uStack_c4;
  int local_c0;
  Allocator *local_b8;
  int iStack_b0;
  int iStack_ac;
  int iStack_a8;
  int iStack_a4;
  int aiStack_a0 [2];
  size_t local_98;
  void *local_90;
  undefined4 uStack_88;
  undefined4 uStack_84;
  undefined4 uStack_80;
  undefined4 uStack_7c;
  undefined4 uStack_78;
  long *local_70;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined4 local_58;
  undefined8 local_50;
  ModelBinFromMatArray local_40;
  
  p_Var1 = this->_vptr_Convolution_x86[-3];
  if (*(int *)(p_Var1 + 0x28 + (long)&(this->weight_winograd63_data).data) != 0) {
    return 0;
  }
  switch(*(undefined4 *)(p_Var1 + 0x24 + (long)&(this->weight_winograd43_data).data)) {
  case 1:
    uStack_f0 = 0x1a08a0;
    pLVar11 = create_layer(0x1a);
    uStack_f0 = 0x1a08b0;
    ParamDict::ParamDict(&pd);
    uStack_f0 = 0x1a08bc;
    (*pLVar11->_vptr_Layer[2])(pLVar11,&pd);
    break;
  case 2:
    uStack_f0 = 0x1a0980;
    pLVar11 = create_layer(0x1a);
    uStack_f0 = 0x1a0990;
    ParamDict::ParamDict(&pd);
    uStack_f0 = 0x1a09a6;
    ParamDict::set(&pd,0,**(float **)(p_Var1 + 0x28 + (long)&(this->weight_winograd43_data).data));
    uStack_f0 = 0x1a09b4;
    (*pLVar11->_vptr_Layer[2])(pLVar11,&pd);
    break;
  case 3:
    uStack_f0 = 0x1a08f6;
    pLVar11 = create_layer(0x36);
    uStack_f0 = 0x1a0906;
    ParamDict::ParamDict(&pd);
    uStack_f0 = 0x1a091c;
    ParamDict::set(&pd,0,**(float **)(p_Var1 + 0x28 + (long)&(this->weight_winograd43_data).data));
    uStack_f0 = 0x1a0938;
    ParamDict::set(&pd,1,*(float *)(*(long *)(p_Var1 + 0x28 +
                                             (long)&(this->weight_winograd43_data).data) + 4));
    uStack_f0 = 0x1a0946;
    (*pLVar11->_vptr_Layer[2])(pLVar11,&pd);
    break;
  case 4:
    uStack_f0 = 0x1a0955;
    pLVar11 = create_layer(0x1e);
    uStack_f0 = 0x1a0965;
    ParamDict::ParamDict(&pd);
    uStack_f0 = 0x1a0971;
    (*pLVar11->_vptr_Layer[2])(pLVar11,&pd);
    break;
  case 5:
    uStack_f0 = 0x1a08cb;
    pLVar11 = create_layer(0x47);
    uStack_f0 = 0x1a08db;
    ParamDict::ParamDict(&pd);
    uStack_f0 = 0x1a08e7;
    (*pLVar11->_vptr_Layer[2])(pLVar11,&pd);
    break;
  case 6:
    uStack_f0 = 0x1a09c0;
    pLVar11 = create_layer(0x43);
    uStack_f0 = 0x1a09d0;
    ParamDict::ParamDict(&pd);
    uStack_f0 = 0x1a09e6;
    ParamDict::set(&pd,0,**(float **)(p_Var1 + 0x28 + (long)&(this->weight_winograd43_data).data));
    uStack_f0 = 0x1a0a02;
    ParamDict::set(&pd,1,*(float *)(*(long *)(p_Var1 + 0x28 +
                                             (long)&(this->weight_winograd43_data).data) + 4));
    uStack_f0 = 0x1a0a10;
    (*pLVar11->_vptr_Layer[2])(pLVar11,&pd);
    break;
  default:
    pLVar11 = (Layer *)0x0;
    goto LAB_001a0a1a;
  }
  uStack_f0 = 0x1a0a1a;
  ParamDict::~ParamDict(&pd);
LAB_001a0a1a:
  if (pLVar11 != (Layer *)0x0) {
    uStack_f0 = 0x1a0a2b;
    (*pLVar11->_vptr_Layer[4])(pLVar11,opt);
  }
  this->activation = pLVar11;
  if ((opt->use_int8_inference == true) &&
     (*(long *)(this->_vptr_Convolution_x86[-3] + 0x40 + (long)&(this->weight_winograd63_data).data)
      == 1)) {
    uStack_f0 = 0x1a0a53;
    create_pipeline_int8_x86(this,opt);
    return 0;
  }
  p_Var1 = this->_vptr_Convolution_x86[-3];
  uVar17 = *(uint *)(p_Var1 + 0x30 + (long)&(this->weight_winograd23_data).data);
  kernel_w = *(uint *)(p_Var1 + 0x34 + (long)&(this->weight_winograd23_data).data);
  kernel_h = *(uint *)(p_Var1 + 0x38 + (long)&(this->weight_winograd23_data).data);
  uVar6 = (long)*(int *)(p_Var1 + 0x1c + (long)&(this->weight_winograd43_data).data) /
          (long)(int)(kernel_h * kernel_w);
  uVar6 = (long)((ulong)(uint)((int)uVar6 >> 0x1f) << 0x20 | uVar6 & 0xffffffff) / (long)(int)uVar17
  ;
  if ((((kernel_w == kernel_h && opt->use_packing_layout == false) &&
       (*(int *)(p_Var1 + 0x3c + (long)&(this->weight_winograd23_data).data) != 1)) &&
      (*(int *)(p_Var1 + 0x40 + (long)&(this->weight_winograd23_data).data) ==
       *(int *)(p_Var1 + 0x3c + (long)&(this->weight_winograd23_data).data))) &&
     ((*(int *)(p_Var1 + 0x44 + (long)&(this->weight_winograd23_data).data) == 1 &&
      (*(int *)(p_Var1 + (long)&(this->weight_winograd43_data).data) == 1)))) {
    uStack_f0 = 0x1a0ae1;
    pLVar11 = create_layer(6);
    this->convolution_dilation1 = pLVar11;
    uStack_f0 = 0x1a0af3;
    ParamDict::ParamDict(&pd_5);
    uStack_f0 = 0x1a0b0b;
    ParamDict::set(&pd_5,0,*(int *)(this->_vptr_Convolution_x86[-3] + 0x30 +
                                   (long)&(this->weight_winograd23_data).data));
    uStack_f0 = 0x1a0b26;
    ParamDict::set(&pd_5,1,*(int *)(this->_vptr_Convolution_x86[-3] + 0x34 +
                                   (long)&(this->weight_winograd23_data).data));
    uStack_f0 = 0x1a0b41;
    ParamDict::set(&pd_5,0xb,
                   *(int *)(this->_vptr_Convolution_x86[-3] + 0x38 +
                           (long)&(this->weight_winograd23_data).data));
    uStack_f0 = 0x1a0b53;
    ParamDict::set(&pd_5,2,1);
    uStack_f0 = 0x1a0b65;
    ParamDict::set(&pd_5,0xc,1);
    uStack_f0 = 0x1a0b77;
    ParamDict::set(&pd_5,3,1);
    uStack_f0 = 0x1a0b89;
    ParamDict::set(&pd_5,0xd,1);
    uStack_f0 = 0x1a0b98;
    ParamDict::set(&pd_5,4,0);
    uStack_f0 = 0x1a0ba7;
    ParamDict::set(&pd_5,0xe,0);
    uStack_f0 = 0x1a0bc2;
    ParamDict::set(&pd_5,5,*(int *)(this->_vptr_Convolution_x86[-3] + 0x18 +
                                   (long)&(this->weight_winograd43_data).data));
    uStack_f0 = 0x1a0bdd;
    ParamDict::set(&pd_5,6,*(int *)(this->_vptr_Convolution_x86[-3] + 0x1c +
                                   (long)&(this->weight_winograd43_data).data));
    uStack_f0 = 0x1a0bed;
    (*this->convolution_dilation1->_vptr_Layer[2])(this->convolution_dilation1,&pd_5);
    pp_Var2 = this->_vptr_Convolution_x86;
    if (*(int *)(pp_Var2[-3] + 0x18 + (long)&(this->weight_winograd43_data).data) == 0) {
      local_98 = 0;
      pd._vptr_ParamDict = (_func_int **)0x0;
      pd.d._0_4_ = 0;
      pd.d._4_4_ = 0;
      uStack_c4 = 0;
      local_c0 = 0;
      local_b8 = (Allocator *)0x0;
      iStack_b0 = 0;
      iStack_ac = 0;
      iStack_a8 = 0;
      iStack_a4 = 0;
      aiStack_a0[0] = 0;
      p_Var1 = pp_Var2[-3];
      if (&pd != (ParamDict *)(p_Var1 + 0x30 + (long)&(this->weight_winograd63_data).data)) {
        piVar3 = *(int **)(p_Var1 + 0x38 + (long)&(this->weight_winograd63_data).data);
        if (piVar3 != (int *)0x0) {
          LOCK();
          *piVar3 = *piVar3 + 1;
          UNLOCK();
        }
        pd._vptr_ParamDict =
             *(_func_int ***)(p_Var1 + 0x30 + (long)&(this->weight_winograd63_data).data);
        pd.d._0_4_ = (undefined4)
                     *(undefined8 *)(p_Var1 + 0x38 + (long)&(this->weight_winograd63_data).data);
        pd.d._4_4_ = (undefined4)
                     ((ulong)*(undefined8 *)
                              (p_Var1 + 0x38 + (long)&(this->weight_winograd63_data).data) >> 0x20);
        uStack_c4 = (undefined4)
                    ((ulong)*(undefined8 *)
                             (p_Var1 + 0x40 + (long)&(this->weight_winograd63_data).data) >> 0x20);
        local_c0 = *(int *)((long)&this->convolution_dilation1 + (long)p_Var1);
        local_b8 = *(Allocator **)(p_Var1 + (long)&(this->scale_in_data).data);
        iStack_b0 = (int)*(undefined8 *)(p_Var1 + 8 + (long)&(this->scale_in_data).data);
        iStack_ac = (int)((ulong)*(undefined8 *)(p_Var1 + 8 + (long)&(this->scale_in_data).data) >>
                         0x20);
        iStack_a8 = (int)*(undefined8 *)(p_Var1 + 0x10 + (long)&(this->scale_in_data).data);
        iStack_a4 = (int)((ulong)*(undefined8 *)(p_Var1 + 0x10 + (long)&(this->scale_in_data).data)
                         >> 0x20);
        aiStack_a0[0] = *(int *)(p_Var1 + 0x18 + (long)&(this->scale_in_data).data);
        local_98 = *(size_t *)(p_Var1 + 0x20 + (long)&(this->scale_in_data).data);
      }
      pLVar11 = this->convolution_dilation1;
      uStack_f0 = 0x1a19b3;
      ModelBinFromMatArray::ModelBinFromMatArray(&local_40,(Mat *)&pd);
      uStack_f0 = 0x1a19c4;
      (*pLVar11->_vptr_Layer[3])(pLVar11,&local_40);
      uStack_f0 = 0x1a19d1;
      ModelBinFromMatArray::~ModelBinFromMatArray(&local_40);
      piVar3 = (int *)CONCAT44(pd.d._4_4_,pd.d._0_4_);
      if (piVar3 != (int *)0x0) {
        LOCK();
        *piVar3 = *piVar3 + -1;
        UNLOCK();
        if (*piVar3 == 0) {
          if (local_b8 == (Allocator *)0x0) {
            if (pd._vptr_ParamDict != (_func_int **)0x0) {
              uStack_f0 = 0x1a1a13;
              free(pd._vptr_ParamDict);
            }
          }
          else {
            uStack_f0 = 0x1a19fd;
            (*local_b8->_vptr_Allocator[3])();
          }
        }
      }
    }
    else {
      lVar13 = 0x40;
      do {
        *(undefined8 *)((long)&pd._vptr_ParamDict + lVar13) = 0;
        *(undefined8 *)((long)&uStackY_118 + lVar13) = 0;
        *(undefined8 *)(&stack0xfffffffffffffef0 + lVar13) = 0;
        *(undefined8 *)((long)&uStackY_10c + lVar13) = 0;
        *(undefined8 *)(&stack0xfffffffffffffefc + lVar13) = 0;
        *(undefined8 *)(&stack0xffffffffffffff08 + lVar13) = 0;
        *(undefined8 *)((long)&stack0xffffffffffffff10 + lVar13) = 0;
        *(undefined8 *)(auStack_ec + lVar13) = 0;
        *(undefined8 *)((long)&pd_5._vptr_ParamDict + lVar13 + 4) = 0;
        lVar13 = lVar13 + 0x48;
      } while (lVar13 != 0xd0);
      p_Var1 = pp_Var2[-3];
      if (&pd != (ParamDict *)(p_Var1 + 0x30 + (long)&(this->weight_winograd63_data).data)) {
        piVar3 = *(int **)(p_Var1 + 0x38 + (long)&(this->weight_winograd63_data).data);
        if (piVar3 != (int *)0x0) {
          LOCK();
          *piVar3 = *piVar3 + 1;
          UNLOCK();
        }
        piVar3 = (int *)CONCAT44(pd.d._4_4_,pd.d._0_4_);
        if (piVar3 != (int *)0x0) {
          LOCK();
          *piVar3 = *piVar3 + -1;
          UNLOCK();
          if (*piVar3 == 0) {
            if (local_b8 == (Allocator *)0x0) {
              if (pd._vptr_ParamDict != (_func_int **)0x0) {
                uStack_f0 = 0x1a165f;
                free(pd._vptr_ParamDict);
              }
            }
            else {
              uStack_f0 = 0x1a0c92;
              (*local_b8->_vptr_Allocator[3])();
            }
          }
        }
        pd._vptr_ParamDict =
             *(_func_int ***)(p_Var1 + 0x30 + (long)&(this->weight_winograd63_data).data);
        pd.d._0_4_ = (undefined4)
                     *(undefined8 *)(p_Var1 + 0x38 + (long)&(this->weight_winograd63_data).data);
        pd.d._4_4_ = (undefined4)
                     ((ulong)*(undefined8 *)
                              (p_Var1 + 0x38 + (long)&(this->weight_winograd63_data).data) >> 0x20);
        uStack_c4 = (undefined4)
                    ((ulong)*(undefined8 *)
                             (p_Var1 + 0x40 + (long)&(this->weight_winograd63_data).data) >> 0x20);
        local_c0 = *(int *)((long)&this->convolution_dilation1 + (long)p_Var1);
        local_b8 = *(Allocator **)(p_Var1 + (long)&(this->scale_in_data).data);
        iStack_b0 = *(int *)(p_Var1 + 8 + (long)&(this->scale_in_data).data);
        iStack_ac = *(int *)(p_Var1 + 0xc + (long)&(this->scale_in_data).data);
        iStack_a8 = *(int *)(p_Var1 + 0x10 + (long)&(this->scale_in_data).data);
        iStack_a4 = *(int *)(p_Var1 + 0x14 + (long)&(this->scale_in_data).data);
        aiStack_a0[0] = *(int *)(p_Var1 + 0x18 + (long)&(this->scale_in_data).data);
        local_98 = *(size_t *)(p_Var1 + 0x20 + (long)&(this->scale_in_data).data);
      }
      p_Var1 = this->_vptr_Convolution_x86[-3];
      if (&local_90 != (void **)(p_Var1 + 0x28 + (long)&(this->scale_in_data).data)) {
        piVar3 = *(int **)(p_Var1 + 0x30 + (long)&(this->scale_in_data).data);
        if (piVar3 != (int *)0x0) {
          LOCK();
          *piVar3 = *piVar3 + 1;
          UNLOCK();
        }
        piVar3 = (int *)CONCAT44(uStack_84,uStack_88);
        if (piVar3 != (int *)0x0) {
          LOCK();
          *piVar3 = *piVar3 + -1;
          UNLOCK();
          if (*piVar3 == 0) {
            if (local_70 == (long *)0x0) {
              if (local_90 != (void *)0x0) {
                uStack_f0 = 0x1a173a;
                free(local_90);
              }
            }
            else {
              uStack_f0 = 0x1a172b;
              (**(code **)(*local_70 + 0x18))();
            }
          }
        }
        local_90 = *(void **)(p_Var1 + 0x28 + (long)&(this->scale_in_data).data);
        uStack_88 = (undefined4)*(undefined8 *)(p_Var1 + 0x30 + (long)&(this->scale_in_data).data);
        uStack_84 = (undefined4)
                    ((ulong)*(undefined8 *)(p_Var1 + 0x30 + (long)&(this->scale_in_data).data) >>
                    0x20);
        uStack_80 = (undefined4)*(undefined8 *)(p_Var1 + 0x38 + (long)&(this->scale_in_data).data);
        uStack_7c = (undefined4)
                    ((ulong)*(undefined8 *)(p_Var1 + 0x38 + (long)&(this->scale_in_data).data) >>
                    0x20);
        uStack_78 = *(undefined4 *)(p_Var1 + 0x40 + (long)&(this->scale_in_data).data);
        local_70 = *(long **)(&this->field_0x1c8 + (long)p_Var1);
        local_68 = *(undefined8 *)(&this->field_0x1d0 + (long)p_Var1);
        uStack_60 = *(undefined8 *)(&this->field_0x1d8 + (long)p_Var1);
        local_58 = *(undefined4 *)(&this->field_0x1e0 + (long)p_Var1);
        local_50 = *(undefined8 *)(&this->field_0x1e8 + (long)p_Var1);
      }
      pLVar11 = this->convolution_dilation1;
      uStack_f0 = 0x1a17dd;
      ModelBinFromMatArray::ModelBinFromMatArray(&local_40,(Mat *)&pd);
      uStack_f0 = 0x1a17ee;
      (*pLVar11->_vptr_Layer[3])(pLVar11,&local_40);
      uStack_f0 = 0x1a17fb;
      ModelBinFromMatArray::~ModelBinFromMatArray(&local_40);
      lVar13 = 0x48;
      do {
        piVar3 = *(int **)((long)&pd.d + lVar13);
        if (piVar3 != (int *)0x0) {
          LOCK();
          *piVar3 = *piVar3 + -1;
          UNLOCK();
          if (*piVar3 == 0) {
            pvVar5 = *(void **)((long)&pd._vptr_ParamDict + lVar13);
            if (*(long **)((long)&local_b8 + lVar13) == (long *)0x0) {
              if (pvVar5 != (void *)0x0) {
                uStack_f0 = 0x1a183a;
                free(pvVar5);
              }
            }
            else {
              uStack_f0 = 0x1a1828;
              (**(code **)(**(long **)((long)&local_b8 + lVar13) + 0x18))();
            }
          }
        }
        *(undefined8 *)((long)&local_98 + lVar13) = 0;
        *(undefined8 *)((long)&pd.d + lVar13 + 4) = 0;
        *(undefined8 *)((long)&uStack_c4 + lVar13) = 0;
        *(undefined8 *)((long)&pd._vptr_ParamDict + lVar13) = 0;
        *(undefined8 *)((long)&pd.d + lVar13) = 0;
        *(undefined8 *)((long)&iStack_b0 + lVar13) = 0;
        *(undefined8 *)((long)&iStack_a8 + lVar13) = 0;
        *(undefined4 *)((long)aiStack_a0 + lVar13) = 0;
        lVar13 = lVar13 + -0x48;
      } while (lVar13 != -0x48);
    }
    uStack_f0 = 0x1a1879;
    (*this->convolution_dilation1->_vptr_Layer[4])(this->convolution_dilation1,opt);
    if (opt->lightmode == true) {
      p_Var1 = this->_vptr_Convolution_x86[-3];
      piVar3 = *(int **)(p_Var1 + 0x38 + (long)&(this->weight_winograd63_data).data);
      if (piVar3 != (int *)0x0) {
        LOCK();
        *piVar3 = *piVar3 + -1;
        UNLOCK();
        if (*piVar3 == 0) {
          if (*(long **)(p_Var1 + (long)&(this->scale_in_data).data) == (long *)0x0) {
            if (*(void **)(p_Var1 + 0x30 + (long)&(this->weight_winograd63_data).data) !=
                (void *)0x0) {
              uStack_f0 = 0x1a18c4;
              free(*(void **)(p_Var1 + 0x30 + (long)&(this->weight_winograd63_data).data));
            }
          }
          else {
            uStack_f0 = 0x1a18b5;
            (**(code **)(**(long **)(p_Var1 + (long)&(this->scale_in_data).data) + 0x18))();
          }
        }
      }
      *(undefined8 *)(p_Var1 + 0x20 + (long)&(this->scale_in_data).data) = 0;
      *(undefined8 *)(p_Var1 + 0x3c + (long)&(this->weight_winograd63_data).data) = 0;
      *(undefined8 *)(p_Var1 + 0x44 + (long)&(this->weight_winograd63_data).data) = 0;
      *(undefined8 *)(p_Var1 + 0x30 + (long)&(this->weight_winograd63_data).data) = 0;
      *(undefined8 *)(p_Var1 + 0x38 + (long)&(this->weight_winograd63_data).data) = 0;
      *(undefined8 *)(p_Var1 + 8 + (long)&(this->scale_in_data).data) = 0;
      *(undefined8 *)(p_Var1 + 0x10 + (long)&(this->scale_in_data).data) = 0;
      *(undefined4 *)(p_Var1 + 0x18 + (long)&(this->scale_in_data).data) = 0;
    }
    uStack_f0 = 0x1a18fe;
    ParamDict::~ParamDict(&pd_5);
    return 0;
  }
  cVar19 = '\x01';
  cVar18 = '\x01';
  if (opt->use_packing_layout != false) {
    cVar19 = ((uVar6 & 3) == 0) * '\x03' + '\x01';
    cVar18 = ((uVar17 & 3) == 0) * '\x03' + '\x01';
  }
  inch = (int)uVar6;
  if ((cVar19 == '\x04') && (cVar18 == '\x04')) {
    if ((((kernel_w ^ 1) == 0 && (kernel_h ^ 1) == 0) &&
        ((((*(int *)(p_Var1 + 0x3c + (long)&(this->weight_winograd23_data).data) == 1 &&
           (*(int *)(p_Var1 + 0x40 + (long)&(this->weight_winograd23_data).data) == 1)) &&
          (*(int *)(p_Var1 + 0x44 + (long)&(this->weight_winograd23_data).data) == 1)) &&
         (*(int *)(p_Var1 + (long)&(this->weight_winograd43_data).data) == 1)))) ||
       ((((uVar10 = kernel_w ^ 1 | kernel_h ^ 1, uVar10 == 0 &&
          (*(int *)(p_Var1 + 0x3c + (long)&(this->weight_winograd23_data).data) == 1)) &&
         (*(int *)(p_Var1 + 0x40 + (long)&(this->weight_winograd23_data).data) == 1)) &&
        ((*(int *)(p_Var1 + 0x44 + (long)&(this->weight_winograd23_data).data) == 2 &&
         (*(int *)(p_Var1 + (long)&(this->weight_winograd43_data).data) == 2)))))) {
      kernel_w = 1;
      kernel_h = 1;
    }
    else {
      if (opt->use_winograd_convolution == true) {
        bVar14 = opt->use_winograd23_convolution;
        uVar7 = (undefined3)(uVar10 >> 8);
        if ((bVar14 == false) && (opt->use_winograd43_convolution == false)) {
          if (((kernel_h == 3) && (kernel_w == 3)) && (opt->use_winograd63_convolution != false)) {
LAB_001a0dac:
            if (((*(int *)(p_Var1 + 0x3c + (long)&(this->weight_winograd23_data).data) == 1) &&
                (*(int *)(p_Var1 + 0x40 + (long)&(this->weight_winograd23_data).data) == 1)) &&
               ((*(int *)(p_Var1 + 0x44 + (long)&(this->weight_winograd23_data).data) == 1 &&
                (*(int *)(p_Var1 + (long)&(this->weight_winograd43_data).data) == 1)))) {
              if (((opt->use_winograd63_convolution != true) || (inch < 8)) ||
                 ((0x18 < uVar17 - 8 || (0x20 < inch)))) {
                bVar15 = bVar14 | opt->use_winograd43_convolution;
                kernel_w = CONCAT31(uVar7,bVar15);
                if (bVar15 != 0) {
                  opt_00 = (Option *)(ulong)CONCAT31(uVar7,7 < inch);
                  if (((bVar14 | opt->use_winograd63_convolution) == 1) &&
                     ((7 < (int)uVar17 & opt->use_winograd43_convolution & 7 < inch) == 0)) {
                    uStack_f0 = 0x1a0e3c;
                    conv3x3s1_winograd23_transform_kernel_pack4_sse
                              ((Mat *)(p_Var1 + 0x30 + (long)&(this->weight_winograd63_data).data),
                               &this->weight_winograd23_data,inch,uVar17,opt_00);
                  }
                  else {
                    uStack_f0 = 0x1a1911;
                    conv3x3s1_winograd43_transform_kernel_pack4_sse
                              ((Mat *)(p_Var1 + 0x30 + (long)&(this->weight_winograd63_data).data),
                               &this->weight_winograd43_data,inch,uVar17,opt_00);
                  }
                  goto LAB_001a0ef2;
                }
              }
              uStack_f0 = 0x1a1625;
              conv3x3s1_winograd63_transform_kernel_pack4_sse
                        ((Mat *)(p_Var1 + 0x30 + (long)&(this->weight_winograd63_data).data),
                         &this->weight_winograd63_data,inch,uVar17,(Option *)(ulong)kernel_w);
              goto LAB_001a0ef2;
            }
          }
        }
        else if (kernel_h == 3 && kernel_w == 3) goto LAB_001a0dac;
      }
      if (*(int *)(p_Var1 + 0x3c + (long)&(this->weight_winograd23_data).data) == 1) {
        if (((*(int *)(p_Var1 + 0x40 + (long)&(this->weight_winograd23_data).data) == 1) &&
            (*(int *)(p_Var1 + 0x44 + (long)&(this->weight_winograd23_data).data) == 1)) &&
           (*(int *)(p_Var1 + (long)&(this->weight_winograd43_data).data) == 1)) {
          bVar14 = false;
          if (((int)uVar17 < 0xc) && (bVar14 = false, inch < 0xc)) goto code_r0x001a0e78;
        }
        else {
code_r0x001a0e78:
          if (((*(int *)(p_Var1 + 0x40 + (long)&(this->weight_winograd23_data).data) != 1) ||
              ((*(int *)(p_Var1 + 0x44 + (long)&(this->weight_winograd23_data).data) < 2 &&
               (*(int *)(p_Var1 + (long)&(this->weight_winograd43_data).data) < 2)))) ||
             ((bVar14 = false, (int)uVar17 < 0x10 && (inch < 0x10)))) goto LAB_001a0e9f;
        }
      }
      else {
LAB_001a0e9f:
        if ((1 < *(int *)(p_Var1 + 0x3c + (long)&(this->weight_winograd23_data).data)) ||
           (bVar14 = true, 1 < *(int *)(p_Var1 + 0x40 + (long)&(this->weight_winograd23_data).data))
           ) {
          bVar14 = (int)uVar17 < 0x10 && inch < 0x10;
        }
      }
      if ((opt->use_sgemm_convolution != true) || (bVar14)) {
        uStack_f0 = 4;
        uStackY_100 = 0x1a0eee;
        convolution_transform_kernel_packed_sse
                  ((Mat *)(p_Var1 + 0x30 + (long)&(this->weight_winograd63_data).data),
                   &this->weight_data_tm,inch,uVar17,kernel_w,kernel_h,4,4);
        goto LAB_001a0ef2;
      }
    }
    uStack_f0 = 0x1a0eda;
    convolution_im2col_sgemm_transform_kernel_pack4_sse
              ((Mat *)(p_Var1 + 0x30 + (long)&(this->weight_winograd63_data).data),
               &this->weight_sgemm_data,inch,uVar17,kernel_w,kernel_h);
  }
LAB_001a0ef2:
  if ((cVar19 == '\x01') && (cVar18 == '\x04')) {
    p_Var1 = this->_vptr_Convolution_x86[-3];
    iVar16 = *(int *)(p_Var1 + 0x34 + (long)&(this->weight_winograd23_data).data);
    if ((iVar16 == 1) &&
       (((((*(int *)(p_Var1 + 0x38 + (long)&(this->weight_winograd23_data).data) == 1 &&
           (*(int *)(p_Var1 + 0x3c + (long)&(this->weight_winograd23_data).data) == 1)) &&
          (*(int *)(p_Var1 + 0x40 + (long)&(this->weight_winograd23_data).data) == 1)) &&
         ((*(int *)(p_Var1 + 0x44 + (long)&(this->weight_winograd23_data).data) == 1 &&
          (*(int *)(p_Var1 + (long)&(this->weight_winograd43_data).data) == 1)))) ||
        ((((*(int *)(p_Var1 + 0x38 + (long)&(this->weight_winograd23_data).data) == 1 &&
           ((*(int *)(p_Var1 + 0x3c + (long)&(this->weight_winograd23_data).data) == 1 &&
            (*(int *)(p_Var1 + 0x40 + (long)&(this->weight_winograd23_data).data) == 1)))) &&
          (*(int *)(p_Var1 + 0x44 + (long)&(this->weight_winograd23_data).data) == 2)) &&
         (*(int *)(p_Var1 + (long)&(this->weight_winograd43_data).data) == 2)))))) {
      iVar12 = *(int *)(p_Var1 + 0x30 + (long)&(this->weight_winograd23_data).data);
      iVar16 = 1;
      kernel_h_00 = 1;
LAB_001a10e2:
      uStack_f0 = 0x1a10e7;
      convolution_im2col_sgemm_transform_kernel_pack1to4_sse
                ((Mat *)(p_Var1 + 0x30 + (long)&(this->weight_winograd63_data).data),
                 &this->weight_sgemm_data,inch,iVar12,iVar16,kernel_h_00);
    }
    else {
      if ((iVar16 == 3) &&
         (((((*(int *)(p_Var1 + 0x38 + (long)&(this->weight_winograd23_data).data) == 3 &&
             (*(int *)(p_Var1 + 0x3c + (long)&(this->weight_winograd23_data).data) == 1)) &&
            (*(int *)(p_Var1 + 0x40 + (long)&(this->weight_winograd23_data).data) == 1)) &&
           ((*(int *)(p_Var1 + 0x44 + (long)&(this->weight_winograd23_data).data) == 1 &&
            (*(int *)(p_Var1 + (long)&(this->weight_winograd43_data).data) == 1)))) ||
          (((*(int *)(p_Var1 + 0x38 + (long)&(this->weight_winograd23_data).data) == 3 &&
            ((*(int *)(p_Var1 + 0x3c + (long)&(this->weight_winograd23_data).data) == 1 &&
             (*(int *)(p_Var1 + 0x40 + (long)&(this->weight_winograd23_data).data) == 1)))) &&
           ((*(int *)(p_Var1 + 0x44 + (long)&(this->weight_winograd23_data).data) == 2 &&
            (*(int *)(p_Var1 + (long)&(this->weight_winograd43_data).data) == 2)))))))) {
        iVar12 = *(int *)(p_Var1 + 0x30 + (long)&(this->weight_winograd23_data).data);
        iVar16 = 3;
        kernel_h_00 = 3;
      }
      else {
        if ((*(int *)(p_Var1 + 0x3c + (long)&(this->weight_winograd23_data).data) == 1) &&
           (((((*(int *)(p_Var1 + 0x40 + (long)&(this->weight_winograd23_data).data) == 1 &&
               (*(int *)(p_Var1 + 0x44 + (long)&(this->weight_winograd23_data).data) == 1)) &&
              (*(int *)(p_Var1 + (long)&(this->weight_winograd43_data).data) == 1)) &&
             ((0xb < inch ||
              (0xb < *(int *)(p_Var1 + 0x30 + (long)&(this->weight_winograd23_data).data))))) ||
            (((*(int *)(p_Var1 + 0x40 + (long)&(this->weight_winograd23_data).data) == 1 &&
              ((1 < *(int *)(p_Var1 + 0x44 + (long)&(this->weight_winograd23_data).data) ||
               (1 < *(int *)(p_Var1 + (long)&(this->weight_winograd43_data).data))))) &&
             ((0xf < inch ||
              (0xf < *(int *)(p_Var1 + 0x30 + (long)&(this->weight_winograd23_data).data))))))))) {
LAB_001a10ac:
          bVar14 = false;
        }
        else if ((1 < *(int *)(p_Var1 + 0x3c + (long)&(this->weight_winograd23_data).data)) ||
                (bVar14 = true,
                1 < *(int *)(p_Var1 + 0x40 + (long)&(this->weight_winograd23_data).data))) {
          if (0xf < inch) goto LAB_001a10ac;
          bVar14 = *(int *)(p_Var1 + 0x30 + (long)&(this->weight_winograd23_data).data) < 0x10;
        }
        iVar12 = *(int *)(p_Var1 + 0x30 + (long)&(this->weight_winograd23_data).data);
        kernel_h_00 = *(int *)(p_Var1 + 0x38 + (long)&(this->weight_winograd23_data).data);
        if ((opt->use_sgemm_convolution == true) && (!bVar14)) goto LAB_001a10e2;
      }
      uStack_f0 = 4;
      uStackY_100 = 0x1a10fb;
      convolution_transform_kernel_packed_sse
                ((Mat *)(p_Var1 + 0x30 + (long)&(this->weight_winograd63_data).data),
                 &this->weight_data_tm,inch,iVar12,iVar16,kernel_h_00,1,4);
    }
  }
  if ((cVar19 == '\x04') && (cVar18 == '\x01')) {
    p_Var1 = this->_vptr_Convolution_x86[-3];
    uVar17 = *(uint *)(p_Var1 + 0x34 + (long)&(this->weight_winograd23_data).data);
    if ((uVar17 == 1) &&
       (((((*(int *)(p_Var1 + 0x38 + (long)&(this->weight_winograd23_data).data) == 1 &&
           (*(int *)(p_Var1 + 0x3c + (long)&(this->weight_winograd23_data).data) == 1)) &&
          (*(int *)(p_Var1 + 0x40 + (long)&(this->weight_winograd23_data).data) == 1)) &&
         ((*(int *)(p_Var1 + 0x44 + (long)&(this->weight_winograd23_data).data) == 1 &&
          (*(int *)(p_Var1 + (long)&(this->weight_winograd43_data).data) == 1)))) ||
        ((((*(int *)(p_Var1 + 0x38 + (long)&(this->weight_winograd23_data).data) == 1 &&
           ((*(int *)(p_Var1 + 0x3c + (long)&(this->weight_winograd23_data).data) == 1 &&
            (*(int *)(p_Var1 + 0x40 + (long)&(this->weight_winograd23_data).data) == 1)))) &&
          (*(int *)(p_Var1 + 0x44 + (long)&(this->weight_winograd23_data).data) == 2)) &&
         (*(int *)(p_Var1 + (long)&(this->weight_winograd43_data).data) == 2)))))) {
      iVar16 = *(int *)(p_Var1 + 0x30 + (long)&(this->weight_winograd23_data).data);
      uVar17 = 1;
      iVar12 = 1;
LAB_001a12c2:
      uStack_f0 = 0x1a12c7;
      convolution_im2col_sgemm_transform_kernel_pack4to1_sse
                ((Mat *)(p_Var1 + 0x30 + (long)&(this->weight_winograd63_data).data),
                 &this->weight_sgemm_data,inch,iVar16,uVar17,iVar12);
    }
    else if ((((opt->use_winograd_convolution == true) && (uVar17 == 3)) &&
             (opt->use_winograd63_convolution != false)) &&
            (((*(int *)(p_Var1 + 0x38 + (long)&(this->weight_winograd23_data).data) == 3 &&
              (*(int *)(p_Var1 + 0x3c + (long)&(this->weight_winograd23_data).data) == 1)) &&
             ((*(int *)(p_Var1 + 0x40 + (long)&(this->weight_winograd23_data).data) == 1 &&
              ((*(int *)(p_Var1 + 0x44 + (long)&(this->weight_winograd23_data).data) == 1 &&
               (*(int *)(p_Var1 + (long)&(this->weight_winograd43_data).data) == 1)))))))) {
      uStack_f0 = 0x1a1210;
      conv3x3s1_winograd63_transform_kernel_pack4to1_sse
                ((Mat *)(p_Var1 + 0x30 + (long)&(this->weight_winograd63_data).data),
                 &this->weight_winograd63_data,inch,
                 *(int *)(p_Var1 + 0x30 + (long)&(this->weight_winograd23_data).data),
                 (Option *)(ulong)uVar17);
    }
    else {
      if ((*(int *)(p_Var1 + 0x3c + (long)&(this->weight_winograd23_data).data) == 1) &&
         (((((*(int *)(p_Var1 + 0x40 + (long)&(this->weight_winograd23_data).data) == 1 &&
             (*(int *)(p_Var1 + 0x44 + (long)&(this->weight_winograd23_data).data) == 1)) &&
            (*(int *)(p_Var1 + (long)&(this->weight_winograd43_data).data) == 1)) &&
           ((0xb < inch ||
            (0xb < *(int *)(p_Var1 + 0x30 + (long)&(this->weight_winograd23_data).data))))) ||
          (((*(int *)(p_Var1 + 0x40 + (long)&(this->weight_winograd23_data).data) == 1 &&
            ((1 < *(int *)(p_Var1 + 0x44 + (long)&(this->weight_winograd23_data).data) ||
             (1 < *(int *)(p_Var1 + (long)&(this->weight_winograd43_data).data))))) &&
           ((0xf < inch ||
            (0xf < *(int *)(p_Var1 + 0x30 + (long)&(this->weight_winograd23_data).data))))))))) {
LAB_001a128c:
        bVar14 = false;
      }
      else if ((1 < *(int *)(p_Var1 + 0x3c + (long)&(this->weight_winograd23_data).data)) ||
              (bVar14 = true,
              1 < *(int *)(p_Var1 + 0x40 + (long)&(this->weight_winograd23_data).data))) {
        if (0xf < inch) goto LAB_001a128c;
        bVar14 = *(int *)(p_Var1 + 0x30 + (long)&(this->weight_winograd23_data).data) < 0x10;
      }
      iVar16 = *(int *)(p_Var1 + 0x30 + (long)&(this->weight_winograd23_data).data);
      iVar12 = *(int *)(p_Var1 + 0x38 + (long)&(this->weight_winograd23_data).data);
      if ((opt->use_sgemm_convolution == true) && (!bVar14)) goto LAB_001a12c2;
      uStack_f0 = 1;
      uStackY_100 = 0x1a12db;
      convolution_transform_kernel_packed_sse
                ((Mat *)(p_Var1 + 0x30 + (long)&(this->weight_winograd63_data).data),
                 &this->weight_data_tm,inch,iVar16,uVar17,iVar12,4,1);
    }
  }
  if ((cVar19 != '\x01') || (cVar18 != '\x01')) goto LAB_001a1511;
  p_Var1 = this->_vptr_Convolution_x86[-3];
  uVar17 = *(uint *)(p_Var1 + 0x34 + (long)&(this->weight_winograd23_data).data);
  if ((uVar17 == 1) &&
     (((((*(int *)(p_Var1 + 0x38 + (long)&(this->weight_winograd23_data).data) == 1 &&
         (*(int *)(p_Var1 + 0x3c + (long)&(this->weight_winograd23_data).data) == 1)) &&
        (*(int *)(p_Var1 + 0x40 + (long)&(this->weight_winograd23_data).data) == 1)) &&
       ((*(int *)(p_Var1 + 0x44 + (long)&(this->weight_winograd23_data).data) == 1 &&
        (*(int *)(p_Var1 + (long)&(this->weight_winograd43_data).data) == 1)))) ||
      (((*(int *)(p_Var1 + 0x38 + (long)&(this->weight_winograd23_data).data) == 1 &&
        ((*(int *)(p_Var1 + 0x3c + (long)&(this->weight_winograd23_data).data) == 1 &&
         (*(int *)(p_Var1 + 0x40 + (long)&(this->weight_winograd23_data).data) == 1)))) &&
       ((*(int *)(p_Var1 + 0x44 + (long)&(this->weight_winograd23_data).data) == 2 &&
        (*(int *)(p_Var1 + (long)&(this->weight_winograd43_data).data) == 2)))))))) {
    iVar16 = *(int *)(p_Var1 + 0x30 + (long)&(this->weight_winograd23_data).data);
    uVar17 = 1;
    iVar12 = 1;
  }
  else {
    if (opt->use_winograd_convolution == true) {
      bVar15 = opt->use_winograd23_convolution;
      if ((bool)bVar15 == false) {
        if ((uVar17 == 3) && (opt->use_winograd43_convolution != false)) goto LAB_001a13bf;
      }
      else if (uVar17 == 3) {
LAB_001a13bf:
        if ((((*(int *)(p_Var1 + 0x38 + (long)&(this->weight_winograd23_data).data) == 3) &&
             (*(int *)(p_Var1 + 0x3c + (long)&(this->weight_winograd23_data).data) == 1)) &&
            (*(int *)(p_Var1 + 0x40 + (long)&(this->weight_winograd23_data).data) == 1)) &&
           ((*(int *)(p_Var1 + 0x44 + (long)&(this->weight_winograd23_data).data) == 1 &&
            (*(int *)(p_Var1 + (long)&(this->weight_winograd43_data).data) == 1)))) {
          if ((opt->use_winograd43_convolution == true) && (0xf < inch)) {
            bVar15 = *(int *)(p_Var1 + 0x30 + (long)&(this->weight_winograd23_data).data) < 0x10 &
                     bVar15;
          }
          if (bVar15 == 0) {
            uStack_f0 = 0x1a142d;
            conv3x3s1_winograd43_transform_kernel_sse
                      ((Mat *)(p_Var1 + 0x30 + (long)&(this->weight_winograd63_data).data),
                       &this->weight_winograd43_data,inch,
                       *(int *)(p_Var1 + 0x30 + (long)&(this->weight_winograd23_data).data),
                       (Option *)(ulong)uVar17);
          }
          else {
            uStack_f0 = 0x1a164d;
            conv3x3s1_winograd23_transform_kernel_sse
                      ((Mat *)(p_Var1 + 0x30 + (long)&(this->weight_winograd63_data).data),
                       &this->weight_winograd23_data,inch,
                       *(int *)(p_Var1 + 0x30 + (long)&(this->weight_winograd23_data).data),
                       (Option *)(ulong)uVar17);
          }
          goto LAB_001a1511;
        }
      }
    }
    if (opt->use_sgemm_convolution != true) {
      if (p_Var1 != (_func_int *)0xfffffffffffffeb0) {
        piVar3 = *(int **)(p_Var1 + 0x38 + (long)&(this->weight_winograd63_data).data);
        if (piVar3 != (int *)0x0) {
          LOCK();
          *piVar3 = *piVar3 + 1;
          UNLOCK();
        }
        piVar3 = (this->weight_data_tm).refcount;
        if (piVar3 != (int *)0x0) {
          LOCK();
          *piVar3 = *piVar3 + -1;
          UNLOCK();
          if (*piVar3 == 0) {
            pvVar5 = (this->weight_data_tm).data;
            pAVar4 = (this->weight_data_tm).allocator;
            if (pAVar4 == (Allocator *)0x0) {
              if (pvVar5 != (void *)0x0) {
                uStack_f0 = 0x1a14b2;
                free(pvVar5);
              }
            }
            else {
              uStack_f0 = 0x1a14a3;
              (*pAVar4->_vptr_Allocator[3])();
            }
          }
        }
        (this->weight_data_tm).cstep = 0;
        *(undefined8 *)((long)&(this->weight_data_tm).refcount + 4) = 0;
        *(undefined8 *)((long)&(this->weight_data_tm).elemsize + 4) = 0;
        (this->weight_data_tm).data = (void *)0x0;
        (this->weight_data_tm).refcount = (int *)0x0;
        (this->weight_data_tm).dims = 0;
        (this->weight_data_tm).w = 0;
        (this->weight_data_tm).h = 0;
        (this->weight_data_tm).d = 0;
        (this->weight_data_tm).c = 0;
        piVar3 = *(int **)(p_Var1 + 0x30 + (long)&(this->weight_winograd63_data).data + 8);
        (this->weight_data_tm).data =
             *(void **)(p_Var1 + 0x30 + (long)&(this->weight_winograd63_data).data);
        (this->weight_data_tm).refcount = piVar3;
        (this->weight_data_tm).elemsize =
             *(size_t *)(p_Var1 + 0x40 + (long)&(this->weight_winograd63_data).data);
        (this->weight_data_tm).elempack =
             *(int *)((long)&this->convolution_dilation1 + (long)p_Var1);
        (this->weight_data_tm).allocator =
             *(Allocator **)(p_Var1 + (long)&(this->scale_in_data).data);
        uVar8 = *(undefined8 *)(p_Var1 + 8 + (long)&(this->scale_in_data).data);
        uVar9 = *(undefined8 *)(p_Var1 + 8 + (long)&(this->scale_in_data).data + 8);
        (this->weight_data_tm).dims = (int)uVar8;
        (this->weight_data_tm).w = (int)((ulong)uVar8 >> 0x20);
        (this->weight_data_tm).h = (int)uVar9;
        (this->weight_data_tm).d = (int)((ulong)uVar9 >> 0x20);
        (this->weight_data_tm).c = *(int *)(p_Var1 + 0x18 + (long)&(this->scale_in_data).data);
        (this->weight_data_tm).cstep =
             *(size_t *)(p_Var1 + 0x20 + (long)&(this->scale_in_data).data);
      }
      goto LAB_001a1511;
    }
    iVar16 = *(int *)(p_Var1 + 0x30 + (long)&(this->weight_winograd23_data).data);
    iVar12 = *(int *)(p_Var1 + 0x38 + (long)&(this->weight_winograd23_data).data);
  }
  uStack_f0 = 0x1a145b;
  convolution_im2col_sgemm_transform_kernel_sse
            ((Mat *)(p_Var1 + 0x30 + (long)&(this->weight_winograd63_data).data),
             &this->weight_sgemm_data,inch,iVar16,uVar17,iVar12);
LAB_001a1511:
  if (opt->lightmode == true) {
    p_Var1 = this->_vptr_Convolution_x86[-3];
    piVar3 = *(int **)(p_Var1 + 0x38 + (long)&(this->weight_winograd63_data).data);
    if (piVar3 != (int *)0x0) {
      LOCK();
      *piVar3 = *piVar3 + -1;
      UNLOCK();
      if (*piVar3 == 0) {
        if (*(long **)(p_Var1 + (long)&(this->scale_in_data).data) == (long *)0x0) {
          if (*(void **)(p_Var1 + 0x30 + (long)&(this->weight_winograd63_data).data) != (void *)0x0)
          {
            uStack_f0 = 0x1a1566;
            free(*(void **)(p_Var1 + 0x30 + (long)&(this->weight_winograd63_data).data));
          }
        }
        else {
          uStack_f0 = 0x1a1557;
          (**(code **)(**(long **)(p_Var1 + (long)&(this->scale_in_data).data) + 0x18))();
        }
      }
    }
    *(undefined8 *)(p_Var1 + 0x20 + (long)&(this->scale_in_data).data) = 0;
    *(undefined8 *)(p_Var1 + 0x3c + (long)&(this->weight_winograd63_data).data) = 0;
    *(undefined8 *)(p_Var1 + 0x44 + (long)&(this->weight_winograd63_data).data) = 0;
    *(undefined8 *)(p_Var1 + 0x30 + (long)&(this->weight_winograd63_data).data) = 0;
    *(undefined8 *)(p_Var1 + 0x38 + (long)&(this->weight_winograd63_data).data) = 0;
    *(undefined8 *)(p_Var1 + 8 + (long)&(this->scale_in_data).data) = 0;
    *(undefined8 *)(p_Var1 + 0x10 + (long)&(this->scale_in_data).data) = 0;
    *(undefined4 *)(p_Var1 + 0x18 + (long)&(this->scale_in_data).data) = 0;
  }
  return 0;
}

Assistant:

int Convolution_x86::create_pipeline(const Option& opt)
{
    if (dynamic_weight)
        return 0;

    activation = create_activation_layer(activation_type, activation_params, opt);

#if NCNN_INT8
    if (opt.use_int8_inference && weight_data.elemsize == (size_t)1u)
    {
        return create_pipeline_int8_x86(opt);
    }
#endif

    int kernel_size = kernel_w * kernel_h;
    int num_input = weight_data_size / kernel_size / num_output;

    if (!opt.use_packing_layout && kernel_w == kernel_h && dilation_w != 1 && dilation_h == dilation_w && stride_w == 1 && stride_h == 1)
    {
        convolution_dilation1 = ncnn::create_layer(ncnn::LayerType::Convolution);

        // set param
        ncnn::ParamDict pd;
        pd.set(0, num_output); // num_output
        pd.set(1, kernel_w);
        pd.set(11, kernel_h);
        pd.set(2, 1);
        pd.set(12, 1);
        pd.set(3, 1);  // stride_w
        pd.set(13, 1); // stride_h
        pd.set(4, 0);  // pad_w
        pd.set(14, 0); // pad_h
        pd.set(5, bias_term);
        pd.set(6, weight_data_size);

        convolution_dilation1->load_param(pd);

        // set weights
        if (bias_term)
        {
            ncnn::Mat weights[2];
            weights[0] = weight_data;
            weights[1] = bias_data;

            convolution_dilation1->load_model(ModelBinFromMatArray(weights));
        }
        else
        {
            ncnn::Mat weights[1];
            weights[0] = weight_data;

            convolution_dilation1->load_model(ModelBinFromMatArray(weights));
        }

        convolution_dilation1->create_pipeline(opt);

        if (opt.lightmode)
        {
            weight_data.release();
        }

        return 0;
    }

    int elempack = 1;
    int out_elempack = 1;

#if __SSE2__
    if (opt.use_packing_layout)
    {
#if __AVX512F__
        elempack = num_input % 16 == 0 ? 16 : num_input % 8 == 0 ? 8 : num_input % 4 == 0 ? 4 : 1;
        out_elempack = num_output % 16 == 0 ? 16 : num_output % 8 == 0 ? 8 : num_output % 4 == 0 ? 4 : 1;
#elif __AVX__
        elempack = num_input % 8 == 0 ? 8 : num_input % 4 == 0 ? 4 : 1;
        out_elempack = num_output % 8 == 0 ? 8 : num_output % 4 == 0 ? 4 : 1;
#else
        elempack = num_input % 4 == 0 ? 4 : 1;
        out_elempack = num_output % 4 == 0 ? 4 : 1;
#endif
    }
#endif // __SSE2__

#if __SSE2__
#if __AVX__
#if __AVX512F__
    if (elempack == 16 && out_elempack == 16)
    {
        if (kernel_w == 1 && kernel_h == 1 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
        {
            convolution_im2col_sgemm_transform_kernel_pack16_avx512(weight_data, weight_sgemm_data, num_input, num_output, kernel_w, kernel_h);
        }
        else if (kernel_w == 1 && kernel_h == 1 && dilation_w == 1 && dilation_h == 1 && stride_w == 2 && stride_h == 2)
        {
            convolution_im2col_sgemm_transform_kernel_pack16_avx512(weight_data, weight_sgemm_data, num_input, num_output, kernel_w, kernel_h);
        }
        else if (opt.use_winograd_convolution && (opt.use_winograd23_convolution || opt.use_winograd43_convolution || opt.use_winograd63_convolution) && kernel_w == 3 && kernel_h == 3 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
        {
            if ((opt.use_winograd63_convolution && num_input >= 32 && num_output >= 32 && num_input <= 128 && num_output <= 128) || (!opt.use_winograd43_convolution && !opt.use_winograd23_convolution))
                conv3x3s1_winograd63_transform_kernel_pack16_avx512(weight_data, weight_winograd63_data, num_input, num_output, opt);
            else if ((opt.use_winograd43_convolution && num_input >= 32 && num_output >= 32) || (!opt.use_winograd63_convolution && !opt.use_winograd23_convolution))
                conv3x3s1_winograd43_transform_kernel_pack16_avx512(weight_data, weight_winograd43_data, num_input, num_output, opt);
            else // if (opt.use_winograd23_convolution)
                conv3x3s1_winograd23_transform_kernel_pack16_avx512(weight_data, weight_winograd23_data, num_input, num_output, opt);
        }
        else if (opt.use_sgemm_convolution)
        {
            convolution_im2col_sgemm_transform_kernel_pack16_avx512(weight_data, weight_sgemm_data, num_input, num_output, kernel_w, kernel_h);
        }
        else
        {
            convolution_transform_kernel_packed_sse(weight_data, weight_data_tm, num_input, num_output, kernel_w, kernel_h, elempack, out_elempack);
        }
    }

    if (elempack == 8 && out_elempack == 16)
    {
        if (kernel_w == 1 && kernel_h == 1 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
        {
            convolution_im2col_sgemm_transform_kernel_pack8to16_avx512(weight_data, weight_sgemm_data, num_input, num_output, kernel_w, kernel_h);
        }
        else if (kernel_w == 1 && kernel_h == 1 && dilation_w == 1 && dilation_h == 1 && stride_w == 2 && stride_h == 2)
        {
            convolution_im2col_sgemm_transform_kernel_pack8to16_avx512(weight_data, weight_sgemm_data, num_input, num_output, kernel_w, kernel_h);
        }
        else if (opt.use_sgemm_convolution)
        {
            convolution_im2col_sgemm_transform_kernel_pack8to16_avx512(weight_data, weight_sgemm_data, num_input, num_output, kernel_w, kernel_h);
        }
        else
        {
            convolution_transform_kernel_packed_sse(weight_data, weight_data_tm, num_input, num_output, kernel_w, kernel_h, elempack, out_elempack);
        }
    }

    if (elempack == 16 && out_elempack == 8)
    {
        if (kernel_w == 1 && kernel_h == 1 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
        {
            convolution_im2col_sgemm_transform_kernel_pack16to8_avx512(weight_data, weight_sgemm_data, num_input, num_output, kernel_w, kernel_h);
        }
        else if (kernel_w == 1 && kernel_h == 1 && dilation_w == 1 && dilation_h == 1 && stride_w == 2 && stride_h == 2)
        {
            convolution_im2col_sgemm_transform_kernel_pack16to8_avx512(weight_data, weight_sgemm_data, num_input, num_output, kernel_w, kernel_h);
        }
        else if (opt.use_sgemm_convolution)
        {
            convolution_im2col_sgemm_transform_kernel_pack16to8_avx512(weight_data, weight_sgemm_data, num_input, num_output, kernel_w, kernel_h);
        }
        else
        {
            convolution_transform_kernel_packed_sse(weight_data, weight_data_tm, num_input, num_output, kernel_w, kernel_h, elempack, out_elempack);
        }
    }

    if (elempack == 4 && out_elempack == 16)
    {
        if (kernel_w == 1 && kernel_h == 1 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
        {
            convolution_im2col_sgemm_transform_kernel_pack4to16_avx512(weight_data, weight_sgemm_data, num_input, num_output, kernel_w, kernel_h);
        }
        else if (kernel_w == 1 && kernel_h == 1 && dilation_w == 1 && dilation_h == 1 && stride_w == 2 && stride_h == 2)
        {
            convolution_im2col_sgemm_transform_kernel_pack4to16_avx512(weight_data, weight_sgemm_data, num_input, num_output, kernel_w, kernel_h);
        }
        else if (opt.use_sgemm_convolution)
        {
            convolution_im2col_sgemm_transform_kernel_pack4to16_avx512(weight_data, weight_sgemm_data, num_input, num_output, kernel_w, kernel_h);
        }
        else
        {
            convolution_transform_kernel_packed_sse(weight_data, weight_data_tm, num_input, num_output, kernel_w, kernel_h, elempack, out_elempack);
        }
    }

    if (elempack == 16 && out_elempack == 4)
    {
        if (kernel_w == 1 && kernel_h == 1 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
        {
            convolution_im2col_sgemm_transform_kernel_pack16to4_avx512(weight_data, weight_sgemm_data, num_input, num_output, kernel_w, kernel_h);
        }
        else if (kernel_w == 1 && kernel_h == 1 && dilation_w == 1 && dilation_h == 1 && stride_w == 2 && stride_h == 2)
        {
            convolution_im2col_sgemm_transform_kernel_pack16to4_avx512(weight_data, weight_sgemm_data, num_input, num_output, kernel_w, kernel_h);
        }
        else if (opt.use_sgemm_convolution)
        {
            convolution_im2col_sgemm_transform_kernel_pack16to4_avx512(weight_data, weight_sgemm_data, num_input, num_output, kernel_w, kernel_h);
        }
        else
        {
            convolution_transform_kernel_packed_sse(weight_data, weight_data_tm, num_input, num_output, kernel_w, kernel_h, elempack, out_elempack);
        }
    }

    if (elempack == 1 && out_elempack == 16)
    {
        if (kernel_w == 1 && kernel_h == 1 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
        {
            convolution_im2col_sgemm_transform_kernel_pack1to16_avx512(weight_data, weight_sgemm_data, num_input, num_output, kernel_w, kernel_h);
        }
        else if (kernel_w == 1 && kernel_h == 1 && dilation_w == 1 && dilation_h == 1 && stride_w == 2 && stride_h == 2)
        {
            convolution_im2col_sgemm_transform_kernel_pack1to16_avx512(weight_data, weight_sgemm_data, num_input, num_output, kernel_w, kernel_h);
        }
        else if (opt.use_sgemm_convolution)
        {
            convolution_im2col_sgemm_transform_kernel_pack1to16_avx512(weight_data, weight_sgemm_data, num_input, num_output, kernel_w, kernel_h);
        }
        else
        {
            convolution_transform_kernel_packed_sse(weight_data, weight_data_tm, num_input, num_output, kernel_w, kernel_h, elempack, out_elempack);
        }
    }

    if (elempack == 16 && out_elempack == 1)
    {
        if (kernel_w == 1 && kernel_h == 1 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
        {
            convolution_im2col_sgemm_transform_kernel_pack16to1_avx512(weight_data, weight_sgemm_data, num_input, num_output, kernel_w, kernel_h);
        }
        else if (kernel_w == 1 && kernel_h == 1 && dilation_w == 1 && dilation_h == 1 && stride_w == 2 && stride_h == 2)
        {
            convolution_im2col_sgemm_transform_kernel_pack16to1_avx512(weight_data, weight_sgemm_data, num_input, num_output, kernel_w, kernel_h);
        }
        else if (kernel_w == 3 && kernel_h == 3 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
        {
            if (opt.use_winograd_convolution && opt.use_winograd63_convolution)
            {
                conv3x3s1_winograd63_transform_kernel_pack16to1_avx512(weight_data, weight_winograd63_data, num_input, num_output, opt);
            }
            else
            {
                convolution_transform_kernel_packed_sse(weight_data, weight_data_tm, num_input, num_output, kernel_w, kernel_h, elempack, out_elempack);
            }
        }
        else if (opt.use_sgemm_convolution)
        {
            convolution_im2col_sgemm_transform_kernel_pack16to1_avx512(weight_data, weight_sgemm_data, num_input, num_output, kernel_w, kernel_h);
        }
        else
        {
            convolution_transform_kernel_packed_sse(weight_data, weight_data_tm, num_input, num_output, kernel_w, kernel_h, elempack, out_elempack);
        }
    }

#endif // __AVX512F__

    // pack8
    if (elempack == 8 && out_elempack == 8)
    {
        if (kernel_w == 1 && kernel_h == 1 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
        {
            convolution_im2col_sgemm_transform_kernel_pack8_avx(weight_data, weight_sgemm_data, num_input, num_output, kernel_w, kernel_h);
        }
        else if (kernel_w == 1 && kernel_h == 1 && dilation_w == 1 && dilation_h == 1 && stride_w == 2 && stride_h == 2)
        {
            convolution_im2col_sgemm_transform_kernel_pack8_avx(weight_data, weight_sgemm_data, num_input, num_output, kernel_w, kernel_h);
        }
        else if (opt.use_winograd_convolution && (opt.use_winograd23_convolution || opt.use_winograd43_convolution || opt.use_winograd63_convolution) && kernel_w == 3 && kernel_h == 3 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1 && (num_input > 8 || num_output > 8))
        {
            if ((opt.use_winograd63_convolution && num_input >= 16 && num_output >= 16 && num_input <= 64 && num_output <= 64) || (!opt.use_winograd43_convolution && !opt.use_winograd23_convolution))
                conv3x3s1_winograd63_transform_kernel_pack8_avx(weight_data, weight_winograd63_data, num_input, num_output, opt);
            else if ((opt.use_winograd43_convolution && num_input >= 16 && num_output >= 16) || (!opt.use_winograd63_convolution && !opt.use_winograd23_convolution))
                conv3x3s1_winograd43_transform_kernel_pack8_avx(weight_data, weight_winograd43_data, num_input, num_output, opt);
            else // if (opt.use_winograd23_convolution)
                conv3x3s1_winograd23_transform_kernel_pack8_avx(weight_data, weight_winograd23_data, num_input, num_output, opt);
        }
        else if (kernel_w == 3 && kernel_h == 3 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
        {
            convolution_transform_kernel_packed_sse(weight_data, weight_data_tm, num_input, num_output, kernel_w, kernel_h, elempack, out_elempack);
        }
        else if (kernel_w == 2 && kernel_h == 2 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
        {
            convolution_transform_kernel_packed_sse(weight_data, weight_data_tm, num_input, num_output, kernel_w, kernel_h, elempack, out_elempack);
        }
        else if (opt.use_sgemm_convolution)
        {
            convolution_im2col_sgemm_transform_kernel_pack8_avx(weight_data, weight_sgemm_data, num_input, num_output, kernel_w, kernel_h);
        }
        else
        {
            convolution_transform_kernel_packed_sse(weight_data, weight_data_tm, num_input, num_output, kernel_w, kernel_h, elempack, out_elempack);
        }
    }

    // pack4to8
    if (elempack == 4 && out_elempack == 8)
    {
        if (kernel_w == 1 && kernel_h == 1 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
        {
            convolution_im2col_sgemm_transform_kernel_pack4to8_avx(weight_data, weight_sgemm_data, num_input, num_output, kernel_w, kernel_h);
        }
        else if (kernel_w == 1 && kernel_h == 1 && dilation_w == 1 && dilation_h == 1 && stride_w == 2 && stride_h == 2)
        {
            convolution_im2col_sgemm_transform_kernel_pack4to8_avx(weight_data, weight_sgemm_data, num_input, num_output, kernel_w, kernel_h);
        }
        else if (opt.use_sgemm_convolution)
        {
            convolution_im2col_sgemm_transform_kernel_pack4to8_avx(weight_data, weight_sgemm_data, num_input, num_output, kernel_w, kernel_h);
        }
        else
        {
            convolution_transform_kernel_packed_sse(weight_data, weight_data_tm, num_input, num_output, kernel_w, kernel_h, elempack, out_elempack);
        }
    }

    // pack1to8
    if (elempack == 1 && out_elempack == 8)
    {
        if (kernel_w == 1 && kernel_h == 1 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
        {
            convolution_im2col_sgemm_transform_kernel_pack1to8_avx(weight_data, weight_sgemm_data, num_input, num_output, kernel_w, kernel_h);
        }
        else if (kernel_w == 1 && kernel_h == 1 && dilation_w == 1 && dilation_h == 1 && stride_w == 2 && stride_h == 2)
        {
            convolution_im2col_sgemm_transform_kernel_pack1to8_avx(weight_data, weight_sgemm_data, num_input, num_output, kernel_w, kernel_h);
        }
        else if (kernel_w == 3 && kernel_h == 3 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
        {
            convolution_transform_kernel_packed_sse(weight_data, weight_data_tm, num_input, num_output, kernel_w, kernel_h, elempack, out_elempack);
        }
        else if (kernel_w == 3 && kernel_h == 3 && dilation_w == 1 && dilation_h == 1 && stride_w == 2 && stride_h == 2)
        {
            convolution_transform_kernel_packed_sse(weight_data, weight_data_tm, num_input, num_output, kernel_w, kernel_h, elempack, out_elempack);
        }
        else if (opt.use_sgemm_convolution)
        {
            convolution_im2col_sgemm_transform_kernel_pack1to8_avx(weight_data, weight_sgemm_data, num_input, num_output, kernel_w, kernel_h);
        }
        else
        {
            convolution_transform_kernel_packed_sse(weight_data, weight_data_tm, num_input, num_output, kernel_w, kernel_h, elempack, out_elempack);
        }
    }

    // pack8to4
    if (elempack == 8 && out_elempack == 4)
    {
        if (kernel_w == 1 && kernel_h == 1 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
        {
            convolution_im2col_sgemm_transform_kernel_pack8to4_avx(weight_data, weight_sgemm_data, num_input, num_output, kernel_w, kernel_h);
        }
        else if (kernel_w == 1 && kernel_h == 1 && dilation_w == 1 && dilation_h == 1 && stride_w == 2 && stride_h == 2)
        {
            convolution_im2col_sgemm_transform_kernel_pack8to4_avx(weight_data, weight_sgemm_data, num_input, num_output, kernel_w, kernel_h);
        }
        else if (opt.use_sgemm_convolution)
        {
            convolution_im2col_sgemm_transform_kernel_pack8to4_avx(weight_data, weight_sgemm_data, num_input, num_output, kernel_w, kernel_h);
        }
        else
        {
            convolution_transform_kernel_packed_sse(weight_data, weight_data_tm, num_input, num_output, kernel_w, kernel_h, elempack, out_elempack);
        }
    }

    // pack8to1
    if (elempack == 8 && out_elempack == 1)
    {
        if (kernel_w == 1 && kernel_h == 1 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
        {
            convolution_im2col_sgemm_transform_kernel_pack8to1_avx(weight_data, weight_sgemm_data, num_input, num_output, kernel_w, kernel_h);
        }
        else if (kernel_w == 1 && kernel_h == 1 && dilation_w == 1 && dilation_h == 1 && stride_w == 2 && stride_h == 2)
        {
            convolution_im2col_sgemm_transform_kernel_pack8to1_avx(weight_data, weight_sgemm_data, num_input, num_output, kernel_w, kernel_h);
        }
        else if (kernel_w == 3 && kernel_h == 3 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
        {
            if (opt.use_winograd_convolution && opt.use_winograd63_convolution)
            {
                conv3x3s1_winograd63_transform_kernel_pack8to1_avx(weight_data, weight_winograd63_data, num_input, num_output, opt);
            }
            else
            {
                convolution_transform_kernel_packed_sse(weight_data, weight_data_tm, num_input, num_output, kernel_w, kernel_h, elempack, out_elempack);
            }
        }
        else if (opt.use_sgemm_convolution)
        {
            convolution_im2col_sgemm_transform_kernel_pack8to1_avx(weight_data, weight_sgemm_data, num_input, num_output, kernel_w, kernel_h);
        }
        else
        {
            convolution_transform_kernel_packed_sse(weight_data, weight_data_tm, num_input, num_output, kernel_w, kernel_h, elempack, out_elempack);
        }
    }
#endif // __AVX__

    // pack4
    if (elempack == 4 && out_elempack == 4)
    {
        if (kernel_w == 1 && kernel_h == 1 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
        {
            convolution_im2col_sgemm_transform_kernel_pack4_sse(weight_data, weight_sgemm_data, num_input, num_output, kernel_w, kernel_h);
        }
        else if (kernel_w == 1 && kernel_h == 1 && dilation_w == 1 && dilation_h == 1 && stride_w == 2 && stride_h == 2)
        {
            convolution_im2col_sgemm_transform_kernel_pack4_sse(weight_data, weight_sgemm_data, num_input, num_output, kernel_w, kernel_h);
        }
        else if (opt.use_winograd_convolution && (opt.use_winograd23_convolution || opt.use_winograd43_convolution || opt.use_winograd63_convolution) && kernel_w == 3 && kernel_h == 3 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
        {
            if ((opt.use_winograd63_convolution && num_input >= 8 && num_output >= 8 && num_input <= 32 && num_output <= 32) || (!opt.use_winograd43_convolution && !opt.use_winograd23_convolution))
                conv3x3s1_winograd63_transform_kernel_pack4_sse(weight_data, weight_winograd63_data, num_input, num_output, opt);
            else if ((opt.use_winograd43_convolution && num_input >= 8 && num_output >= 8) || (!opt.use_winograd63_convolution && !opt.use_winograd23_convolution))
                conv3x3s1_winograd43_transform_kernel_pack4_sse(weight_data, weight_winograd43_data, num_input, num_output, opt);
            else // if (opt.use_winograd23_convolution)
                conv3x3s1_winograd23_transform_kernel_pack4_sse(weight_data, weight_winograd23_data, num_input, num_output, opt);
        }
        else
        {
            bool prefer_sgemm = (dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1 && (num_input >= 12 || num_output >= 12))
                                || (dilation_w == 1 && dilation_h == 1 && (stride_w >= 2 || stride_h >= 2) && (num_input >= 16 || num_output >= 16))
                                || ((dilation_w >= 2 || dilation_h >= 2) && (num_input >= 16 || num_output >= 16));

            if (opt.use_sgemm_convolution && prefer_sgemm)
            {
                convolution_im2col_sgemm_transform_kernel_pack4_sse(weight_data, weight_sgemm_data, num_input, num_output, kernel_w, kernel_h);
            }
            else
            {
                convolution_transform_kernel_packed_sse(weight_data, weight_data_tm, num_input, num_output, kernel_w, kernel_h, elempack, out_elempack);
            }
        }
    }

    // pack1to4
    if (elempack == 1 && out_elempack == 4)
    {
        if (kernel_w == 1 && kernel_h == 1 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
        {
            convolution_im2col_sgemm_transform_kernel_pack1to4_sse(weight_data, weight_sgemm_data, num_input, num_output, kernel_w, kernel_h);
        }
        else if (kernel_w == 1 && kernel_h == 1 && dilation_w == 1 && dilation_h == 1 && stride_w == 2 && stride_h == 2)
        {
            convolution_im2col_sgemm_transform_kernel_pack1to4_sse(weight_data, weight_sgemm_data, num_input, num_output, kernel_w, kernel_h);
        }
        else if (kernel_w == 3 && kernel_h == 3 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
        {
            convolution_transform_kernel_packed_sse(weight_data, weight_data_tm, num_input, num_output, kernel_w, kernel_h, elempack, out_elempack);
        }
        else if (kernel_w == 3 && kernel_h == 3 && dilation_w == 1 && dilation_h == 1 && stride_w == 2 && stride_h == 2)
        {
            convolution_transform_kernel_packed_sse(weight_data, weight_data_tm, num_input, num_output, kernel_w, kernel_h, elempack, out_elempack);
        }
        else
        {
            bool prefer_sgemm = (dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1 && (num_input >= 12 || num_output >= 12))
                                || (dilation_w == 1 && dilation_h == 1 && (stride_w >= 2 || stride_h >= 2) && (num_input >= 16 || num_output >= 16))
                                || ((dilation_w >= 2 || dilation_h >= 2) && (num_input >= 16 || num_output >= 16));

            if (opt.use_sgemm_convolution && prefer_sgemm)
            {
                convolution_im2col_sgemm_transform_kernel_pack1to4_sse(weight_data, weight_sgemm_data, num_input, num_output, kernel_w, kernel_h);
            }
            else
            {
                convolution_transform_kernel_packed_sse(weight_data, weight_data_tm, num_input, num_output, kernel_w, kernel_h, elempack, out_elempack);
            }
        }
    }

    // pack4to1
    if (elempack == 4 && out_elempack == 1)
    {
        if (kernel_w == 1 && kernel_h == 1 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
        {
            convolution_im2col_sgemm_transform_kernel_pack4to1_sse(weight_data, weight_sgemm_data, num_input, num_output, kernel_w, kernel_h);
        }
        else if (kernel_w == 1 && kernel_h == 1 && dilation_w == 1 && dilation_h == 1 && stride_w == 2 && stride_h == 2)
        {
            convolution_im2col_sgemm_transform_kernel_pack4to1_sse(weight_data, weight_sgemm_data, num_input, num_output, kernel_w, kernel_h);
        }
        else if (opt.use_winograd_convolution && opt.use_winograd63_convolution && kernel_w == 3 && kernel_h == 3 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
        {
            conv3x3s1_winograd63_transform_kernel_pack4to1_sse(weight_data, weight_winograd63_data, num_input, num_output, opt);
        }
        else
        {
            bool prefer_sgemm = (dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1 && (num_input >= 12 || num_output >= 12))
                                || (dilation_w == 1 && dilation_h == 1 && (stride_w >= 2 || stride_h >= 2) && (num_input >= 16 || num_output >= 16))
                                || ((dilation_w >= 2 || dilation_h >= 2) && (num_input >= 16 || num_output >= 16));

            if (opt.use_sgemm_convolution && prefer_sgemm)
            {
                convolution_im2col_sgemm_transform_kernel_pack4to1_sse(weight_data, weight_sgemm_data, num_input, num_output, kernel_w, kernel_h);
            }
            else
            {
                convolution_transform_kernel_packed_sse(weight_data, weight_data_tm, num_input, num_output, kernel_w, kernel_h, elempack, out_elempack);
            }
        }
    }
#endif // __SSE2__

    // pack1
    if (elempack == 1 && out_elempack == 1)
    {
        if (kernel_w == 1 && kernel_h == 1 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
        {
            convolution_im2col_sgemm_transform_kernel_sse(weight_data, weight_sgemm_data, num_input, num_output, kernel_w, kernel_h);
        }
        else if (kernel_w == 1 && kernel_h == 1 && dilation_w == 1 && dilation_h == 1 && stride_w == 2 && stride_h == 2)
        {
            convolution_im2col_sgemm_transform_kernel_sse(weight_data, weight_sgemm_data, num_input, num_output, kernel_w, kernel_h);
        }
        else if (opt.use_winograd_convolution && (opt.use_winograd23_convolution || opt.use_winograd43_convolution) && kernel_w == 3 && kernel_h == 3 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
        {
            if ((opt.use_winograd43_convolution && num_input >= 16 && num_output >= 16) || !opt.use_winograd23_convolution)
            {
                conv3x3s1_winograd43_transform_kernel_sse(weight_data, weight_winograd43_data, num_input, num_output, opt);
            }
            else
            {
                conv3x3s1_winograd23_transform_kernel_sse(weight_data, weight_winograd23_data, num_input, num_output, opt);
            }
        }
        else if (opt.use_sgemm_convolution)
        {
            convolution_im2col_sgemm_transform_kernel_sse(weight_data, weight_sgemm_data, num_input, num_output, kernel_w, kernel_h);
        }
        else
        {
            weight_data_tm = weight_data;
        }
    }

    if (opt.lightmode)
    {
        weight_data.release();
    }

    return 0;
}